

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_aws_sigv4.c
# Opt level: O3

CURLcode canon_query(Curl_easy *data,char *query,dynbuf *dq)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  CURLcode CVar4;
  char *pcVar5;
  size_t sVar6;
  undefined7 uVar7;
  size_t len;
  byte *mem;
  char *p;
  byte *mem_00;
  uint uVar8;
  long lVar9;
  size_t *psVar10;
  ulong uVar11;
  char tmp [3];
  pair array [64];
  byte local_448 [4];
  uint local_444;
  ulong local_440;
  size_t local_438 [129];
  
  if (query == (char *)0x0) {
    return CURLE_OK;
  }
  psVar10 = local_438 + 1;
  lVar9 = 0;
  do {
    psVar10[-1] = (size_t)query;
    pcVar5 = strchr(query,0x26);
    if (pcVar5 == (char *)0x0) {
      sVar6 = strlen(query);
      *psVar10 = sVar6;
      uVar8 = (uint)lVar9;
      if (uVar8 != 0x3f) {
        psVar10 = local_438;
        qsort(psVar10,lVar9 + 1,0x10,compare_func);
        uVar11 = 0;
        do {
          sVar6 = psVar10[1];
          CVar4 = CURLE_OK;
          if (sVar6 != 0) {
            mem = (byte *)*psVar10;
            local_444 = 0;
            local_440 = uVar11;
            do {
              bVar1 = *mem;
              if (((byte)(bVar1 - 0x30) < 10) || (uVar7 = 0, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a))
              {
LAB_006a447e:
                len = 1;
                mem_00 = mem;
LAB_006a4489:
                CVar4 = Curl_dyn_addn(dq,mem_00,len);
              }
              else {
                if (bVar1 < 0x3d) {
                  if (bVar1 - 0x2d < 2) goto LAB_006a447e;
                  if (bVar1 != 0x25) goto LAB_006a44b8;
                  if ((((byte)(mem[1] - 0x30) < 10) ||
                      ((uVar3 = mem[1] - 0x41, uVar3 < 0x26 &&
                       ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) != 0)))) &&
                     (((byte)(mem[2] - 0x30) < 10 ||
                      ((uVar3 = mem[2] - 0x41, uVar3 < 0x26 &&
                       ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) != 0)))))) {
                    local_448[2] = 0;
                    local_448[0] = 0x25;
                    local_448[1] = 0;
                    cVar2 = Curl_raw_toupper(mem[1]);
                    local_448[1] = cVar2;
                    local_448[2] = Curl_raw_toupper(mem[2]);
                    CVar4 = Curl_dyn_addn(dq,local_448,3);
                    sVar6 = sVar6 - 2;
                    mem = mem + 2;
                    goto LAB_006a448e;
                  }
                  len = 3;
                  mem_00 = (byte *)"%25";
                  goto LAB_006a4489;
                }
                if (bVar1 != 0x3d) {
                  if ((bVar1 == 0x7e) || (bVar1 == 0x5f)) goto LAB_006a447e;
LAB_006a44b8:
                  local_448[1] = "0123456789ABCDEF"[*mem >> 4];
                  local_448[0] = 0x25;
                  local_448[2] = "0123456789ABCDEF"[*mem & 0xf];
                  len = 3;
                  mem_00 = local_448;
                  goto LAB_006a4489;
                }
                CVar4 = Curl_dyn_addn(dq,mem,1);
                local_444 = (uint)CONCAT71(uVar7,1);
              }
LAB_006a448e:
              uVar11 = local_440;
              sVar6 = sVar6 - 1;
            } while ((sVar6 != 0) && (mem = mem + 1, CVar4 == CURLE_OK));
            if (CVar4 != CURLE_OK) {
              return CVar4;
            }
            if (((local_444 & 1) == 0) && (CVar4 = Curl_dyn_addn(dq,"=",1), CVar4 != CURLE_OK)) {
              return CVar4;
            }
            CVar4 = CURLE_OK;
            if ((uint)uVar11 < uVar8) {
              CVar4 = Curl_dyn_addn(dq,"&",1);
            }
          }
          if (CVar4 != CURLE_OK) {
            return CVar4;
          }
          uVar3 = (uint)uVar11;
          psVar10 = psVar10 + 2;
          uVar11 = (ulong)(uVar3 + 1);
          if (uVar8 <= uVar3) {
            return CURLE_OK;
          }
        } while( true );
      }
      break;
    }
    *psVar10 = (long)pcVar5 - (long)query;
    query = pcVar5 + 1;
    lVar9 = lVar9 + 1;
    psVar10 = psVar10 + 2;
  } while ((int)lVar9 != 0x40);
  Curl_failf(data,"aws-sigv4: too many query pairs in URL");
  return CURLE_URL_MALFORMAT;
}

Assistant:

static CURLcode canon_query(struct Curl_easy *data,
                            const char *query, struct dynbuf *dq)
{
  CURLcode result = CURLE_OK;
  int entry = 0;
  int i;
  const char *p = query;
  struct pair array[MAX_QUERYPAIRS];
  struct pair *ap = &array[0];
  if(!query)
    return result;

  /* sort the name=value pairs first */
  do {
    char *amp;
    entry++;
    ap->p = p;
    amp = strchr(p, '&');
    if(amp)
      ap->len = amp - p; /* excluding the ampersand */
    else {
      ap->len = strlen(p);
      break;
    }
    ap++;
    p = amp + 1;
  } while(entry < MAX_QUERYPAIRS);
  if(entry == MAX_QUERYPAIRS) {
    /* too many query pairs for us */
    failf(data, "aws-sigv4: too many query pairs in URL");
    return CURLE_URL_MALFORMAT;
  }

  qsort(&array[0], entry, sizeof(struct pair), compare_func);

  ap = &array[0];
  for(i = 0; !result && (i < entry); i++, ap++) {
    size_t len;
    const char *q = ap->p;
    bool found_equals = false;
    if(!ap->len)
      continue;
    for(len = ap->len; len && !result; q++, len--) {
      if(ISALNUM(*q))
        result = Curl_dyn_addn(dq, q, 1);
      else {
        switch(*q) {
        case '-':
        case '.':
        case '_':
        case '~':
          /* allowed as-is */
          result = Curl_dyn_addn(dq, q, 1);
          break;
        case '=':
          /* allowed as-is */
          result = Curl_dyn_addn(dq, q, 1);
          found_equals = true;
          break;
        case '%':
          /* uppercase the following if hexadecimal */
          if(ISXDIGIT(q[1]) && ISXDIGIT(q[2])) {
            char tmp[3]="%";
            tmp[1] = Curl_raw_toupper(q[1]);
            tmp[2] = Curl_raw_toupper(q[2]);
            result = Curl_dyn_addn(dq, tmp, 3);
            q += 2;
            len -= 2;
          }
          else
            /* '%' without a following two-digit hex, encode it */
            result = Curl_dyn_addn(dq, "%25", 3);
          break;
        default: {
          /* URL encode */
          const char hex[] = "0123456789ABCDEF";
          char out[3]={'%'};
          out[1] = hex[((unsigned char)*q)>>4];
          out[2] = hex[*q & 0xf];
          result = Curl_dyn_addn(dq, out, 3);
          break;
        }
        }
      }
    }
    if(!result && !found_equals) {
      /* queries without value still need an equals */
      result = Curl_dyn_addn(dq, "=", 1);
    }
    if(!result && i < entry - 1) {
      /* insert ampersands between query pairs */
      result = Curl_dyn_addn(dq, "&", 1);
    }
  }
  return result;
}